

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_writeSetting(SoapySDRDevice *device,char *key,char *value)

{
  Device *in_RDX;
  char *in_RSI;
  exception *ex;
  allocator local_41;
  string local_40 [16];
  char **in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  SoapySDR::Device::writeSetting<char_const*>
            (in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return 0;
}

Assistant:

int SoapySDRDevice_writeSetting(SoapySDRDevice *device, const char *key, const char *value)
{
    __SOAPY_SDR_C_TRY
    device->writeSetting(key, value);
    __SOAPY_SDR_C_CATCH
}